

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  datetime dt;
  date *ptr;
  uint local_48;
  int i;
  date dates [3];
  date current_date;
  
  printf("Year: %i\n",0x7e4);
  printf("Month: %i\n",2);
  printf("Day: %i\n",0x19);
  memcpy(&local_48,&DAT_00102020,0x24);
  for (ptr._4_4_ = 0; ptr._4_4_ < 3; ptr._4_4_ = ptr._4_4_ + 1) {
    printf("%i-%i-%i\n",(ulong)(&local_48)[(long)(int)ptr._4_4_ * 3],
           (ulong)(uint)dates[(long)(int)ptr._4_4_ + -1].day,(ulong)(uint)dates[(int)ptr._4_4_].year
          );
  }
  local_48 = 0x7df;
  i = 5;
  dates[0].year = 0x19;
  printf("Year: %i\n",0x7df);
  printf("Month: %i\n",(ulong)(uint)i);
  printf("Day: %i\n",(ulong)(uint)dates[0].year);
  printf("Year: %i\n",(ulong)local_48);
  printf("Month: %i\n",(ulong)(uint)i);
  printf("Day: %i\n",(ulong)(uint)dates[0].year);
  printf("Year: %i\n",(ulong)(uint)dates[0].month);
  printf("Month: %i\n",(ulong)(uint)dates[0].day);
  printf("Day: %i\n",(ulong)(uint)dates[1].year);
  printf("%i-%i-%i %i:%i:%i\n",0x7e4,0xc,0x19,0xc,0,0);
  return 0;
}

Assistant:

int main() {

    struct date current_date = {2020, .month=2, 25};

    /*
    current_date.year = 2020;
    current_date.month = 2;
    current_date.day = 25;
    */

    printf("Year: %i\n", current_date.year);
    printf("Month: %i\n", current_date.month);
    printf("Day: %i\n", current_date.day);

    struct date dates[] = {
        {2020, 2, 25}, {2020, 3, 26}, {2018, 4, 19}
    };

    for (int i=0; i<sizeof(dates)/sizeof(struct date); i++) {
        printf("%i-%i-%i\n", dates[i].year, dates[i].month, dates[i].day);
    }

    struct date *ptr = dates;
    (*ptr).year = 2015;
    ptr->month = 5;
    ptr->day = 25;

    printf("Year: %i\n", dates[0].year);
    printf("Month: %i\n", dates[0].month);
    printf("Day: %i\n", dates[0].day);

    printf("Year: %i\n", ptr[0].year);
    printf("Month: %i\n", ptr[0].month);
    printf("Day: %i\n", ptr[0].day);

    ptr += 1;

    printf("Year: %i\n", ptr->year);
    printf("Month: %i\n", ptr->month);
    printf("Day: %i\n", ptr->day);

    struct datetime dt = {2020, 12, 25, 12, 00, 00};
    printf("%i-%i-%i %i:%i:%i\n",
            dt.d.year, dt.d.month, dt.d.day,
            dt.t.hour, dt.t.min, dt.t.sec);

    return 0;
}